

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall
itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::assign_impl
          (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *this,size_type count,int *value)

{
  int *piVar1;
  int *piVar2;
  size_t sVar3;
  bool bVar4;
  
  piVar2 = choose_data(this,count);
  this->m_end = piVar2;
  this->m_begin = piVar2;
  piVar1 = piVar2;
  while( true ) {
    bVar4 = count == 0;
    count = count - 1;
    if (bVar4) break;
    *piVar1 = *value;
    this->m_end = piVar1 + 1;
    piVar1 = piVar1 + 1;
  }
  if ((type *)piVar2 == this->m_static_data) {
    sVar3 = 4;
  }
  else {
    sVar3 = this->m_dynamic_capacity;
  }
  this->m_capacity = sVar3;
  return;
}

Assistant:

void assign_impl(size_type count, const T& value)
    {
        assert(m_begin);
        assert(m_begin == m_end);

        m_begin = m_end = choose_data(count);
        for (size_type i = 0; i < count; ++i)
        {
            atraits::construct(get_alloc(), m_end, value);
            ++m_end;
        }

        update_capacity();
    }